

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * pp_get_token(void)

{
  ushort **ppuVar1;
  bool bVar2;
  char *p;
  int termchar;
  int len;
  char *local_18;
  int local_10;
  int local_c;
  char *local_8;
  
  local_10 = 0;
  if ((l == 10) || (l == -1)) {
    local_8 = (char *)0x0;
  }
  else {
    readbyte();
    while( true ) {
      bVar2 = false;
      if ((l != 10) && (bVar2 = false, l != -1)) {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[c] & 0x2000) != 0;
      }
      if (!bVar2) break;
      readbyte();
    }
    ppuVar1 = __ctype_b_loc();
    if ((((*ppuVar1)[c] & 0x2000) == 0) && (c != -1)) {
      eline = line;
      ecolumn = column;
      if (c == 0x22) {
        local_10 = 0x22;
      }
      local_c = 1;
      pp_get_token::buf[0] = (char)c;
      local_18 = pp_get_token::buf + 1;
      do {
        if (((l == -1) || (l == 10)) ||
           ((local_10 == 0 && (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[l] & 0x2000) != 0)))) break;
        readbyte();
        if (local_c < 0x3ff) {
          *local_18 = (char)c;
          local_c = local_c + 1;
          local_18 = local_18 + 1;
        }
      } while ((local_10 == 0) || (c != local_10));
      *local_18 = '\0';
      if (0x3fe < local_c) {
        ccerr(F,"too long line directive");
      }
      local_8 = pp_get_token::buf;
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char* pp_get_token()
{
    static char buf[1024];
    int len = 1;
    int termchar = 0;
    char* p = buf;

    /* end of line reached */
    if (l == '\n' || l == EOF)
        return NULL;

    /* eat up last token's last character */
    readbyte();

    /* skip spaces */
    while (l != '\n' && l != EOF && isspace(c))
        readbyte();

    /* no token */
    if (isspace(c) || c == EOF)
        return NULL;

    eline = line;
    ecolumn = column;

    if (c == '"')
        termchar = '"';

    len = 1;
    *p++ = c;
    while (l != EOF)
    {
        if (l == '\n')
            break;

        if (!termchar && isspace(l))
            break;

        readbyte();
        if (len < 1023)
        {
            *p++ = c;
            ++len;
        }

        if (termchar && c == termchar)
            break;
    }
    *p = 0;

    if (len >= 1023)
        ccerr(F, "too long line directive");

    return buf;
}